

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

uint32_t GetNextKey(uint32_t key,int len)

{
  uint32_t local_10;
  uint32_t step;
  int len_local;
  uint32_t key_local;
  
  for (step = 1 << ((char)len - 1U & 0x1f); (key & step) != 0; step = step >> 1) {
  }
  local_10 = key;
  if (step != 0) {
    local_10 = (key & step - 1) + step;
  }
  return local_10;
}

Assistant:

static WEBP_INLINE uint32_t GetNextKey(uint32_t key, int len) {
  uint32_t step = 1 << (len - 1);
  while (key & step) {
    step >>= 1;
  }
  return step ? (key & (step - 1)) + step : key;
}